

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::
GeometryShaderFramebufferTextureArgumentRefersToBufferTexture
          (GeometryShaderFramebufferTextureArgumentRefersToBufferTexture *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  GLint *pGVar1;
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderFramebufferTextureArgumentRefersToBufferTexture *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderFramebufferTextureArgumentRefersToBufferTexture_0325f148;
  this->m_bo_id = 0;
  this->m_fbo_id = 0;
  this->m_tbo_id = 0;
  this->m_tex_width = 0x40;
  this->m_tex_height = 0x40;
  pGVar1 = (GLint *)operator_new__((ulong)(this->m_tex_height * this->m_tex_width * 3) << 2);
  this->m_texels = pGVar1;
  memset(this->m_texels,0xff,(ulong)(this->m_tex_height * this->m_tex_width * 3));
  return;
}

Assistant:

GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::
	GeometryShaderFramebufferTextureArgumentRefersToBufferTexture(Context& context, const ExtParameters& extParams,
																  const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description), m_bo_id(0), m_fbo_id(0), m_tbo_id(0)
{
	m_tex_width  = 64;
	m_tex_height = 64;

	/* Allocate memory for m_tex_height * m_tex_width texels, with each texel being 3 GLints. */
	m_texels = new glw::GLint[m_tex_height * m_tex_width * 3];

	memset(m_texels, 255, m_tex_height * m_tex_width * 3);
}